

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclTimeIncAddFanins(SC_Man *p,Abc_Obj_t *pObj)

{
  uint uVar1;
  Abc_Obj_t *pObj_00;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < (pObj->vFanins).nSize; lVar2 = lVar2 + 1) {
    pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]];
    uVar1 = *(uint *)&pObj_00->field_0x14;
    if ((uVar1 & 0xf) != 8 && (char)((uVar1 & 0x40) >> 6) == '\0') {
      Abc_SclTimeIncAddNode(p,pObj_00);
    }
  }
  return;
}

Assistant:

static inline void Abc_SclTimeIncAddFanins( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    Abc_ObjForEachFanin( pObj, pFanin, i )
//        if ( !pFanin->fMarkC && Abc_ObjIsNode(pFanin) )
        if ( !pFanin->fMarkC && !Abc_ObjIsLatch(pFanin) )
            Abc_SclTimeIncAddNode( p, pFanin );
}